

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::AssertionResult::getExpressionInMacro_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResult *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->m_info).macroName._M_string_length == 0) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&(this->m_info).capturedExpression);
  }
  else {
    std::operator+(&local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,"( ");
    std::operator+(&bStack_58,&local_38,&(this->m_info).capturedExpression);
    std::operator+(__return_storage_ptr__,&bStack_58," )");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResult::getExpressionInMacro() const {
        if( m_info.macroName.empty() )
            return m_info.capturedExpression;
        else
            return m_info.macroName + "( " + m_info.capturedExpression + " )";
    }